

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9VmIsCallable(jx9_vm *pVm,jx9_value *pValue)

{
  SyHashEntry *pSVar1;
  sxu32 local_2c;
  char *pcStack_28;
  int nLen;
  char *zName;
  jx9_value *pjStack_18;
  int res;
  jx9_value *pValue_local;
  jx9_vm *pVm_local;
  
  zName._4_4_ = 0;
  if ((pValue->iFlags & 1U) != 0) {
    pjStack_18 = pValue;
    pValue_local = (jx9_value *)pVm;
    pcStack_28 = jx9_value_to_string(pValue,(int *)&local_2c);
    pSVar1 = SyHashGet((SyHash *)(pValue_local + 0xc),pcStack_28,local_2c);
    if ((pSVar1 != (SyHashEntry *)0x0) ||
       (pSVar1 = SyHashGet((SyHash *)(pValue_local + 0xb),pcStack_28,local_2c),
       pSVar1 != (SyHashEntry *)0x0)) {
      zName._4_4_ = 1;
    }
  }
  return zName._4_4_;
}

Assistant:

JX9_PRIVATE int jx9VmIsCallable(jx9_vm *pVm, jx9_value *pValue)
{
	int res = 0;
	if( pValue->iFlags & MEMOBJ_STRING ){
		const char *zName;
		int nLen;
		/* Extract the name */
		zName = jx9_value_to_string(pValue, &nLen);
		/* Perform the lookup */
		if( SyHashGet(&pVm->hFunction, (const void *)zName, (sxu32)nLen) != 0 ||
			SyHashGet(&pVm->hHostFunction, (const void *)zName, (sxu32)nLen) != 0 ){
				/* Function is callable */
				res = 1;
		}
	}
	return res;
}